

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _missingAssertions,bool _aborting)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_00161300;
  TestCaseInfo::TestCaseInfo(&this->testInfo,_testInfo);
  sVar6 = (_totals->assertions).passed;
  uVar2 = *(undefined4 *)((long)&(_totals->assertions).passed + 4);
  sVar7 = (_totals->assertions).failed;
  uVar3 = *(undefined4 *)((long)&(_totals->assertions).failed + 4);
  uVar4 = *(undefined4 *)((long)&(_totals->testCases).passed + 4);
  sVar8 = (_totals->testCases).failed;
  uVar5 = *(undefined4 *)((long)&(_totals->testCases).failed + 4);
  *(int *)&(this->totals).testCases.passed = (int)(_totals->testCases).passed;
  *(undefined4 *)((long)&(this->totals).testCases.passed + 4) = uVar4;
  *(int *)&(this->totals).testCases.failed = (int)sVar8;
  *(undefined4 *)((long)&(this->totals).testCases.failed + 4) = uVar5;
  *(int *)&(this->totals).assertions.passed = (int)sVar6;
  *(undefined4 *)((long)&(this->totals).assertions.passed + 4) = uVar2;
  *(int *)&(this->totals).assertions.failed = (int)sVar7;
  *(undefined4 *)((long)&(this->totals).assertions.failed + 4) = uVar3;
  (this->stdOut)._M_dataplus._M_p = (pointer)&(this->stdOut).field_2;
  pcVar1 = (_stdOut->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->stdOut,pcVar1,pcVar1 + _stdOut->_M_string_length);
  (this->stdErr)._M_dataplus._M_p = (pointer)&(this->stdErr).field_2;
  pcVar1 = (_stdErr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->stdErr,pcVar1,pcVar1 + _stdErr->_M_string_length);
  this->missingAssertions = _missingAssertions;
  this->aborting = _aborting;
  return;
}

Assistant:

TestCaseStats(  TestCaseInfo const& _testInfo,
                        Totals const& _totals,
                        std::string const& _stdOut,
                        std::string const& _stdErr,
                        bool _missingAssertions,
                        bool _aborting )
        : testInfo( _testInfo ),
            totals( _totals ),
            stdOut( _stdOut ),
            stdErr( _stdErr ),
            missingAssertions( _missingAssertions ),
            aborting( _aborting )
        {}